

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

array * __thiscall mpt::array::operator=(array *this,array *a)

{
  array *a_local;
  array *this_local;
  
  reference<mpt::array::content>::operator=(&this->_buf,&a->_buf);
  return this;
}

Assistant:

array &array::operator= (const array &a)
{
	_buf = a._buf;
	return *this;
}